

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_proj.c
# Opt level: O1

void PDHG_Restart_Iterate_GPU(CUPDLPwork *pdhg)

{
  CUPDLPproblem *pCVar1;
  CUPDLPresobj *pCVar2;
  CUPDLPiterates *pCVar3;
  CUPDLPstepsize *pCVar4;
  CUPDLPtimers *pCVar5;
  CUPDLPvec *pCVar6;
  CUPDLPvec *pCVar7;
  CUPDLPvec *pCVar8;
  CUPDLPvec *pCVar9;
  PDHG_restart_choice PVar10;
  int iVar11;
  
  pCVar1 = pdhg->problem;
  pCVar2 = pdhg->resobj;
  pCVar3 = pdhg->iterates;
  pCVar4 = pdhg->stepsize;
  pCVar5 = pdhg->timers;
  PVar10 = PDHG_Check_Restart_GPU(pdhg);
  if (PVar10 != PDHG_NO_RESTART) {
    iVar11 = pdhg->timers->nIter % 2;
    pCVar6 = pCVar3->x[iVar11];
    pCVar7 = pCVar3->y[iVar11];
    pCVar8 = pCVar3->ax[iVar11];
    pCVar9 = pCVar3->aty[iVar11];
    pCVar4->dSumPrimalStep = 0.0;
    pCVar4->dSumDualStep = 0.0;
    memset(pCVar3->xSum,0,(long)pCVar1->nCols << 3);
    memset(pCVar3->ySum,0,(long)pCVar1->nRows << 3);
    if (PVar10 == PDHG_RESTART_TO_AVERAGE) {
      pCVar2->dPrimalFeasLastRestart = pCVar2->dPrimalFeasAverage;
      pCVar2->dDualFeasLastRestart = pCVar2->dDualFeasAverage;
      pCVar2->dDualityGapLastRestart = pCVar2->dDualityGapAverage;
      memcpy(pCVar6->data,pCVar3->xAverage->data,(long)pCVar1->nCols << 3);
      memcpy(pCVar7->data,pCVar3->yAverage->data,(long)pCVar1->nRows << 3);
      memcpy(pCVar8->data,pCVar3->axAverage->data,(long)pCVar1->nRows << 3);
      memcpy(pCVar9->data,pCVar3->atyAverage->data,(long)pCVar1->nCols << 3);
    }
    else {
      pCVar2->dPrimalFeasLastRestart = pCVar2->dPrimalFeas;
      pCVar2->dDualFeasLastRestart = pCVar2->dDualFeas;
      pCVar2->dDualityGapLastRestart = pCVar2->dDualityGap;
    }
    PDHG_Compute_Step_Size_Ratio(pdhg);
    memcpy(pCVar3->xLastRestart,pCVar6->data,(long)pCVar1->nCols << 3);
    memcpy(pCVar3->yLastRestart,pCVar7->data,(long)pCVar1->nRows << 3);
    pCVar3->iLastRestartIter = pCVar5->nIter;
    PDHG_Compute_Residuals(pdhg);
    return;
  }
  return;
}

Assistant:

void PDHG_Restart_Iterate_GPU(CUPDLPwork *pdhg) {
  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPiterates *iterates = pdhg->iterates;
  CUPDLPstepsize *stepsize = pdhg->stepsize;
  CUPDLPresobj *resobj = pdhg->resobj;
  CUPDLPtimers *timers = pdhg->timers;

  // PDHG_Compute_Average_Iterate(pdhg);
  PDHG_restart_choice restart_choice = PDHG_Check_Restart_GPU(pdhg);

  if (restart_choice == PDHG_NO_RESTART) return;

  cupdlp_int iter = pdhg->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];

  stepsize->dSumPrimalStep = 0.0;
  stepsize->dSumDualStep = 0.0;
  CUPDLP_ZERO_VEC(iterates->xSum, cupdlp_float, problem->nCols);
  CUPDLP_ZERO_VEC(iterates->ySum, cupdlp_float, problem->nRows);

  if (restart_choice == PDHG_RESTART_TO_AVERAGE) {
    resobj->dPrimalFeasLastRestart = resobj->dPrimalFeasAverage;
    resobj->dDualFeasLastRestart = resobj->dDualFeasAverage;
    resobj->dDualityGapLastRestart = resobj->dDualityGapAverage;

    // cupdlp_copy(iterates->x, iterates->xAverage, cupdlp_float,
    // problem->nCols); cupdlp_copy(iterates->y, iterates->yAverage,
    // cupdlp_float, problem->nRows); cupdlp_copy(iterates->ax,
    // iterates->axAverage, cupdlp_float, problem->nRows);
    // cupdlp_copy(iterates->aty, iterates->atyAverage, cupdlp_float,
    // problem->nCols);

    CUPDLP_COPY_VEC(x->data, iterates->xAverage->data, cupdlp_float, problem->nCols);
    CUPDLP_COPY_VEC(y->data, iterates->yAverage->data, cupdlp_float, problem->nRows);
    CUPDLP_COPY_VEC(ax->data, iterates->axAverage->data, cupdlp_float, problem->nRows);
    CUPDLP_COPY_VEC(aty->data, iterates->atyAverage->data, cupdlp_float, problem->nCols);

  } else {
    resobj->dPrimalFeasLastRestart = resobj->dPrimalFeas;
    resobj->dDualFeasLastRestart = resobj->dDualFeas;
    resobj->dDualityGapLastRestart = resobj->dDualityGap;
  }

  PDHG_Compute_Step_Size_Ratio(pdhg);

  // cupdlp_copy(iterates->xLastRestart, iterates->x, cupdlp_float,
  // problem->nCols); cupdlp_copy(iterates->yLastRestart, iterates->y,
  // cupdlp_float, problem->nRows);

  CUPDLP_COPY_VEC(iterates->xLastRestart, x->data, cupdlp_float, problem->nCols);
  CUPDLP_COPY_VEC(iterates->yLastRestart, y->data, cupdlp_float, problem->nRows);

  iterates->iLastRestartIter = timers->nIter;

  PDHG_Compute_Residuals(pdhg);
  // cupdlp_printf("Recomputed stepsize ratio: %e,  sqrt(ratio)=%e",
  // stepsize->dBeta, sqrt(stepsize->dBeta));
}